

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O0

cell_index_t
itree_add_tri(itree_t *t,cell_id_t left_context,cell_id_t right_context,cell_id_t posn,
             cell_id_t tri_id)

{
  cell_index_t cVar1;
  cell_index_t local_2c;
  cell_index_t parent;
  cell_index_t end;
  cell_id_t tri_id_local;
  cell_id_t posn_local;
  cell_id_t right_context_local;
  cell_id_t left_context_local;
  itree_t *t_local;
  
  parent = tri_id;
  end = posn;
  tri_id_local = right_context;
  posn_local = left_context;
  _right_context_local = t;
  cVar1 = itree_find(t,&local_2c,0,left_context);
  if (cVar1 == 0xffffffff) {
    cVar1 = itree_add_sib(_right_context_local,local_2c,posn_local);
    cVar1 = itree_add_child(_right_context_local,cVar1,tri_id_local);
    t_local._4_4_ = itree_add_child(_right_context_local,cVar1,end);
    _right_context_local->cell[t_local._4_4_].child = parent;
  }
  else {
    cVar1 = itree_find(_right_context_local,&local_2c,_right_context_local->cell[cVar1].child,
                       tri_id_local);
    if (cVar1 == 0xffffffff) {
      cVar1 = itree_add_sib(_right_context_local,local_2c,tri_id_local);
      t_local._4_4_ = itree_add_child(_right_context_local,cVar1,end);
      _right_context_local->cell[t_local._4_4_].child = parent;
    }
    else {
      t_local._4_4_ =
           itree_find(_right_context_local,&local_2c,_right_context_local->cell[cVar1].child,end);
      if (t_local._4_4_ == 0xffffffff) {
        t_local._4_4_ = itree_add_sib(_right_context_local,local_2c,end);
        _right_context_local->cell[t_local._4_4_].child = parent;
      }
    }
  }
  return t_local._4_4_;
}

Assistant:

cell_id_t
itree_add_tri(itree_t *t,
	      cell_id_t left_context,
	      cell_id_t right_context,
	      cell_id_t posn,
	      cell_id_t tri_id)
{
    cell_index_t end;
    cell_index_t parent;

    parent = itree_find(t, &end, 0, left_context);
    if (parent == NULL_INDEX) {
	parent = itree_add_sib(t, end, left_context);
	parent = itree_add_child(t, parent, right_context);
	parent = itree_add_child(t, parent, posn);

	t->cell[parent].child = tri_id;

	return parent;
    }

    parent = itree_find(t, &end, t->cell[parent].child, right_context);
    if (parent == NULL_INDEX) {
	parent = itree_add_sib(t, end, right_context);
	parent = itree_add_child(t, parent, posn);

	t->cell[parent].child = tri_id;

	return parent;
    }
    
    parent = itree_find(t, &end, t->cell[parent].child, posn);
    if (parent == NULL_INDEX) {
	parent = itree_add_sib(t, end, posn);
	
	t->cell[parent].child = tri_id;

	return parent;
    }

    return parent;
}